

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

VkResult fill_out_count_pointer_pair<VkLayerProperties>
                   (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *data_vec,
                   uint32_t *pCount,VkLayerProperties *pData)

{
  VkResult VVar1;
  ulong uVar2;
  long lVar3;
  uint32_t amount_to_write;
  ulong uVar4;
  
  if (pCount != (uint32_t *)0x0) {
    uVar2 = ((long)(data_vec->
                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(data_vec->
                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>)._M_impl
                  .super__Vector_impl_data._M_start) / 0x208;
    if (pData == (VkLayerProperties *)0x0) {
      VVar1 = VK_SUCCESS;
    }
    else {
      uVar4 = uVar2 & 0xffffffff;
      if (*pCount < uVar2) {
        uVar4 = (ulong)*pCount;
      }
      for (lVar3 = 0; uVar4 * 0x208 - lVar3 != 0; lVar3 = lVar3 + 0x208) {
        memcpy(pData->layerName + lVar3,
               ((data_vec->super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                )._M_impl.super__Vector_impl_data._M_start)->layerName + lVar3,0x208);
      }
      VVar1 = (uint)((ulong)*pCount <
                    (ulong)(((long)(data_vec->
                                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(data_vec->
                                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                  )._M_impl.super__Vector_impl_data._M_start) / 0x208)) * 5;
      uVar2 = uVar4;
    }
    *pCount = (uint32_t)uVar2;
    return VVar1;
  }
  return VK_ERROR_OUT_OF_HOST_MEMORY;
}

Assistant:

VkResult fill_out_count_pointer_pair(std::vector<T> const& data_vec, uint32_t* pCount, T* pData) {
    if (pCount == nullptr) {
        return VK_ERROR_OUT_OF_HOST_MEMORY;
    }
    if (pData == nullptr) {
        if (pCount) *pCount = static_cast<uint32_t>(data_vec.size());
        return VK_SUCCESS;
    } else {
        uint32_t amount_written = 0;
        uint32_t amount_to_write = static_cast<uint32_t>(data_vec.size());
        if (*pCount < data_vec.size()) {
            amount_to_write = *pCount;
        }
        for (size_t i = 0; i < amount_to_write; i++) {
            pData[i] = data_vec[i];
            amount_written++;
        }
        if (*pCount < data_vec.size()) {
            *pCount = amount_written;
            return VK_INCOMPLETE;
        }
        *pCount = amount_written;
        return VK_SUCCESS;
    }
}